

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# device.cc
# Opt level: O3

string * __thiscall rcg::Device::getVersion_abi_cxx11_(string *__return_storage_ptr__,Device *this)

{
  mutex *__mutex;
  int iVar1;
  undefined8 uVar2;
  DEVICE_INFO_CMD in_R8D;
  
  __mutex = &this->mtx;
  iVar1 = pthread_mutex_lock((pthread_mutex_t *)__mutex);
  if (iVar1 == 0) {
    (anonymous_namespace)::cDevGetInfo_abi_cxx11_
              (__return_storage_ptr__,(_anonymous_namespace_ *)this,(Device *)&this->gentl,
               (shared_ptr<const_rcg::GenTLWrapper> *)0x8,in_R8D);
    pthread_mutex_unlock((pthread_mutex_t *)__mutex);
    return __return_storage_ptr__;
  }
  uVar2 = std::__throw_system_error(iVar1);
  pthread_mutex_unlock((pthread_mutex_t *)__mutex);
  _Unwind_Resume(uVar2);
}

Assistant:

std::string Device::getVersion()
{
  std::lock_guard<std::mutex> lock(mtx);
  return cDevGetInfo(this, gentl, GenTL::DEVICE_INFO_VERSION);
}